

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void ColorPhiWebs(VmFunction *function)

{
  VmBlock *pVVar1;
  VmInstruction *inst;
  uint color;
  VmInstruction **ppVVar2;
  VmBlock **ppVVar3;
  
  function->nextColor = 0;
  ppVVar3 = &function->firstBlock;
  while (pVVar1 = *ppVVar3, pVVar1 != (VmBlock *)0x0) {
    ppVVar2 = &pVVar1->firstInstruction;
    while (inst = *ppVVar2, inst != (VmInstruction *)0x0) {
      if ((inst->cmd == VM_INST_PHI) && (inst->color == 0)) {
        color = function->nextColor + 1;
        function->nextColor = color;
        ColorPhiWeb(inst,color);
      }
      ppVVar2 = &inst->nextSibling;
    }
    ppVVar3 = &pVVar1->nextSibling;
  }
  return;
}

Assistant:

void ColorPhiWebs(VmFunction* function)
{
	function->nextColor = 0;

	for(VmBlock *block = function->firstBlock; block; block = block->nextSibling)
	{
		for(VmInstruction *inst = block->firstInstruction; inst; inst = inst->nextSibling)
		{
			if(inst->cmd == VM_INST_PHI && inst->color == 0)
				ColorPhiWeb(inst, ++function->nextColor);
		}
	}
}